

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
UnaryExpr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*const_&>::
streamReconstructedExpression
          (UnaryExpr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*const_&>
           *this,ostream *os)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **in_RDX;
  string local_30;
  
  Detail::stringify<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*>
            (&local_30,(Detail *)this->m_lhs,in_RDX);
  std::operator<<((ostream *)os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }